

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coins_tests.cpp
# Opt level: O0

void __thiscall
coins_tests::CacheTest::SimulationTest(CacheTest *this,CCoinsView *base,bool fake_best_block)

{
  bool bVar1;
  int iVar2;
  size_type sVar3;
  reference pvVar4;
  uint64_t uVar5;
  uint64_t uVar6;
  pointer pCVar7;
  reference ppVar8;
  byte in_DL;
  pointer in_RSI;
  long in_FS_OFFSET;
  bool should_erase_1;
  bool should_erase;
  uint flushIndex;
  unique_ptr<(anonymous_namespace)::CCoinsViewCacheTest,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>
  *test;
  vector<std::unique_ptr<(anonymous_namespace)::CCoinsViewCacheTest,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::CCoinsViewCacheTest,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>_>_>
  *__range4_1;
  Coin *coin_1;
  bool have;
  pair<const_COutPoint,_Coin> *entry_1;
  map<COutPoint,_Coin,_std::less<COutPoint>,_std::allocator<std::pair<const_COutPoint,_Coin>_>_>
  *__range4;
  int cacheid;
  bool is_overwrite;
  bool ret;
  Coin *entry;
  bool result_havecoin;
  bool test_havecoin_after;
  bool test_havecoin_before;
  Coin *coin;
  uint i_1;
  uint i;
  bool flushed_without_erase;
  bool uncached_an_entry;
  bool missed_an_entry;
  bool found_an_entry;
  bool updated_an_entry;
  bool removed_an_entry;
  bool added_an_unspendable_entry;
  bool added_an_entry;
  bool reached_4_caches;
  bool removed_all_caches;
  CCoinsView *tip;
  iterator __end4_1;
  iterator __begin4_1;
  iterator __end4;
  iterator __begin4;
  vector<transaction_identifier<false>,_std::allocator<transaction_identifier<false>_>_> txids;
  vector<std::unique_ptr<(anonymous_namespace)::CCoinsViewCacheTest,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::CCoinsViewCacheTest,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>_>_>
  stack;
  COutPoint out;
  Coin newcoin;
  value_type txid;
  map<COutPoint,_Coin,_std::less<COutPoint>,_std::allocator<std::pair<const_COutPoint,_Coin>_>_>
  result;
  CCoinsViewCache *in_stack_fffffffffffff028;
  undefined4 in_stack_fffffffffffff030;
  size_type in_stack_fffffffffffff034;
  CCoinsViewCache *in_stack_fffffffffffff038;
  undefined4 in_stack_fffffffffffff040;
  int in_stack_fffffffffffff044;
  key_type *in_stack_fffffffffffff048;
  COutPoint *in_stack_fffffffffffff050;
  const_string *msg;
  undefined7 in_stack_fffffffffffff058;
  undefined1 in_stack_fffffffffffff05f;
  lazy_ostream *in_stack_fffffffffffff060;
  unit_test_log_t *in_stack_fffffffffffff068;
  const_string *this_00;
  undefined1 in_stack_fffffffffffff077;
  Coin *in_stack_fffffffffffff078;
  COutPoint *in_stack_fffffffffffff080;
  undefined7 in_stack_fffffffffffff088;
  undefined1 in_stack_fffffffffffff08f;
  undefined1 in_stack_fffffffffffff0d7;
  CCoinsViewCacheTest *in_stack_fffffffffffff0d8;
  byte *local_da0;
  uint local_c14;
  uint local_c10;
  byte local_bf7 [15];
  const_string local_be8 [2];
  lazy_ostream local_bc8 [2];
  assertion_result local_ba8 [2];
  const_string local_b70 [2];
  lazy_ostream local_b50 [2];
  assertion_result local_b30 [2];
  const_string local_af8 [2];
  lazy_ostream local_ad8 [2];
  assertion_result local_ab8 [2];
  const_string local_a80 [2];
  lazy_ostream local_a60 [2];
  assertion_result local_a40 [2];
  const_string local_a08 [2];
  lazy_ostream local_9e8 [2];
  assertion_result local_9c8 [2];
  const_string local_990 [2];
  lazy_ostream local_970 [2];
  assertion_result local_950 [2];
  const_string local_918 [2];
  lazy_ostream local_8f8 [2];
  assertion_result local_8d8 [2];
  const_string local_8a0 [2];
  lazy_ostream local_880 [2];
  assertion_result local_860 [2];
  const_string local_828 [2];
  lazy_ostream local_808 [2];
  assertion_result local_7e8 [2];
  const_string local_7b0 [2];
  lazy_ostream local_790 [2];
  assertion_result local_770 [2];
  pointer local_730;
  const_string local_728 [2];
  lazy_ostream local_708 [2];
  assertion_result local_6e8 [2];
  const_string local_6b0 [2];
  lazy_ostream local_690 [2];
  assertion_result local_670 [2];
  unique_ptr<(anonymous_namespace)::CCoinsViewCacheTest,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>
  *local_638;
  unique_ptr<(anonymous_namespace)::CCoinsViewCacheTest,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>
  *local_630;
  const_string local_628 [2];
  lazy_ostream local_608 [2];
  assertion_result local_5e8 [2];
  const_string local_5b0 [2];
  lazy_ostream local_590 [2];
  assertion_result local_570 [2];
  const_string local_538 [2];
  lazy_ostream local_518 [2];
  assertion_result local_4f8 [2];
  _Base_ptr local_4c0;
  _Base_ptr local_4b8;
  const_string local_4b0 [2];
  lazy_ostream local_490 [2];
  assertion_result local_470 [2];
  undefined1 local_431;
  const_string local_430 [2];
  lazy_ostream local_410 [2];
  assertion_result local_3f0 [2];
  undefined1 local_3b1;
  const_string local_3b0 [2];
  lazy_ostream local_390 [2];
  assertion_result local_370 [2];
  const_string local_338 [2];
  lazy_ostream local_318 [2];
  assertion_result local_2f8 [2];
  const_string local_2c0 [2];
  lazy_ostream local_2a0 [2];
  assertion_result local_280 [4];
  pointer local_210;
  CAmount local_158;
  uint local_130;
  undefined1 local_128 [72];
  undefined1 local_e0 [72];
  undefined8 local_98;
  undefined8 uStack_90;
  undefined8 local_88;
  undefined8 uStack_80;
  undefined8 local_58;
  undefined8 local_50;
  undefined8 local_48;
  undefined8 local_40;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_bf7[6] = in_DL & 1;
  local_bf7[5] = 0;
  local_bf7[4] = 0;
  local_bf7[3] = 0;
  local_bf7[2] = 0;
  local_bf7[1] = 0;
  local_bf7[0] = 0;
  local_210 = in_RSI;
  std::
  map<COutPoint,_Coin,_std::less<COutPoint>,_std::allocator<std::pair<const_COutPoint,_Coin>_>_>::
  map((map<COutPoint,_Coin,_std::less<COutPoint>,_std::allocator<std::pair<const_COutPoint,_Coin>_>_>
       *)in_stack_fffffffffffff028);
  std::
  vector<std::unique_ptr<(anonymous_namespace)::CCoinsViewCacheTest,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::CCoinsViewCacheTest,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>_>_>
  ::vector((vector<std::unique_ptr<(anonymous_namespace)::CCoinsViewCacheTest,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::CCoinsViewCacheTest,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>_>_>
            *)in_stack_fffffffffffff028);
  std::make_unique<(anonymous_namespace)::CCoinsViewCacheTest,CCoinsView*&>
            ((CCoinsView **)in_stack_fffffffffffff050);
  std::
  vector<std::unique_ptr<(anonymous_namespace)::CCoinsViewCacheTest,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::CCoinsViewCacheTest,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>_>_>
  ::push_back((vector<std::unique_ptr<(anonymous_namespace)::CCoinsViewCacheTest,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::CCoinsViewCacheTest,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>_>_>
               *)in_stack_fffffffffffff028,(value_type *)0x51a92d);
  std::
  unique_ptr<(anonymous_namespace)::CCoinsViewCacheTest,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>
  ::~unique_ptr((unique_ptr<(anonymous_namespace)::CCoinsViewCacheTest,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>
                 *)in_stack_fffffffffffff038);
  std::vector<transaction_identifier<false>,_std::allocator<transaction_identifier<false>_>_>::
  vector((vector<transaction_identifier<false>,_std::allocator<transaction_identifier<false>_>_> *)
         in_stack_fffffffffffff028);
  std::vector<transaction_identifier<false>,_std::allocator<transaction_identifier<false>_>_>::
  resize((vector<transaction_identifier<false>,_std::allocator<transaction_identifier<false>_>_> *)
         in_stack_fffffffffffff048,CONCAT44(in_stack_fffffffffffff044,in_stack_fffffffffffff040));
  for (local_c10 = 0;
      sVar3 = std::
              vector<transaction_identifier<false>,_std::allocator<transaction_identifier<false>_>_>
              ::size((vector<transaction_identifier<false>,_std::allocator<transaction_identifier<false>_>_>
                      *)in_stack_fffffffffffff028), local_c10 < sVar3; local_c10 = local_c10 + 1) {
    RandomMixin<FastRandomContext>::rand256
              ((RandomMixin<FastRandomContext> *)
               CONCAT17(in_stack_fffffffffffff05f,in_stack_fffffffffffff058));
    transaction_identifier<false>::FromUint256((uint256 *)in_stack_fffffffffffff028);
    pvVar4 = std::
             vector<transaction_identifier<false>,_std::allocator<transaction_identifier<false>_>_>
             ::operator[]((vector<transaction_identifier<false>,_std::allocator<transaction_identifier<false>_>_>
                           *)in_stack_fffffffffffff038,
                          CONCAT44(in_stack_fffffffffffff034,in_stack_fffffffffffff030));
    *(undefined8 *)(pvVar4->m_wrapped).super_base_blob<256U>.m_data._M_elems = local_58;
    *(undefined8 *)((pvVar4->m_wrapped).super_base_blob<256U>.m_data._M_elems + 8) = local_50;
    *(undefined8 *)((pvVar4->m_wrapped).super_base_blob<256U>.m_data._M_elems + 0x10) = local_48;
    *(undefined8 *)((pvVar4->m_wrapped).super_base_blob<256U>.m_data._M_elems + 0x18) = local_40;
  }
  for (local_c14 = 0; local_c14 < 40000; local_c14 = local_c14 + 1) {
    std::vector<transaction_identifier<false>,_std::allocator<transaction_identifier<false>_>_>::
    size((vector<transaction_identifier<false>,_std::allocator<transaction_identifier<false>_>_> *)
         in_stack_fffffffffffff028);
    RandomMixin<FastRandomContext>::randrange<unsigned_long>
              ((RandomMixin<FastRandomContext> *)in_stack_fffffffffffff050,
               (unsigned_long)in_stack_fffffffffffff048);
    pvVar4 = std::
             vector<transaction_identifier<false>,_std::allocator<transaction_identifier<false>_>_>
             ::operator[]((vector<transaction_identifier<false>,_std::allocator<transaction_identifier<false>_>_>
                           *)in_stack_fffffffffffff038,
                          CONCAT44(in_stack_fffffffffffff034,in_stack_fffffffffffff030));
    local_98 = *(undefined8 *)(pvVar4->m_wrapped).super_base_blob<256U>.m_data._M_elems;
    uStack_90 = *(undefined8 *)((pvVar4->m_wrapped).super_base_blob<256U>.m_data._M_elems + 8);
    local_88 = *(undefined8 *)((pvVar4->m_wrapped).super_base_blob<256U>.m_data._M_elems + 0x10);
    uStack_80 = *(undefined8 *)((pvVar4->m_wrapped).super_base_blob<256U>.m_data._M_elems + 0x18);
    COutPoint::COutPoint
              ((COutPoint *)in_stack_fffffffffffff038,
               (Txid *)CONCAT44(in_stack_fffffffffffff034,in_stack_fffffffffffff030),
               (uint32_t)((ulong)in_stack_fffffffffffff028 >> 0x20));
    std::
    map<COutPoint,_Coin,_std::less<COutPoint>,_std::allocator<std::pair<const_COutPoint,_Coin>_>_>::
    operator[]((map<COutPoint,_Coin,_std::less<COutPoint>,_std::allocator<std::pair<const_COutPoint,_Coin>_>_>
                *)in_stack_fffffffffffff050,in_stack_fffffffffffff048);
    uVar5 = RandomMixin<FastRandomContext>::randbits
                      ((RandomMixin<FastRandomContext> *)in_stack_fffffffffffff048,
                       in_stack_fffffffffffff044);
    uVar6 = RandomMixin<FastRandomContext>::randbits
                      ((RandomMixin<FastRandomContext> *)in_stack_fffffffffffff048,
                       in_stack_fffffffffffff044);
    if (uVar5 == 0) {
      std::
      vector<std::unique_ptr<(anonymous_namespace)::CCoinsViewCacheTest,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::CCoinsViewCacheTest,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>_>_>
      ::back((vector<std::unique_ptr<(anonymous_namespace)::CCoinsViewCacheTest,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::CCoinsViewCacheTest,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>_>_>
              *)in_stack_fffffffffffff028);
      pCVar7 = std::
               unique_ptr<(anonymous_namespace)::CCoinsViewCacheTest,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>
               ::operator->((unique_ptr<(anonymous_namespace)::CCoinsViewCacheTest,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>
                             *)in_stack_fffffffffffff028);
      COutPoint::COutPoint
                ((COutPoint *)in_stack_fffffffffffff038,
                 (Txid *)CONCAT44(in_stack_fffffffffffff034,in_stack_fffffffffffff030),
                 (uint32_t)((ulong)in_stack_fffffffffffff028 >> 0x20));
      (*(pCVar7->super_CCoinsViewCache).super_CCoinsViewBacked.super_CCoinsView._vptr_CCoinsView[1])
                (pCVar7,local_e0);
    }
    iVar2 = RandomMixin<FastRandomContext>::randrange<int>
                      ((RandomMixin<FastRandomContext> *)in_stack_fffffffffffff050,
                       (int)((ulong)in_stack_fffffffffffff048 >> 0x20));
    if (iVar2 == 0) {
      std::
      vector<std::unique_ptr<(anonymous_namespace)::CCoinsViewCacheTest,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::CCoinsViewCacheTest,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>_>_>
      ::back((vector<std::unique_ptr<(anonymous_namespace)::CCoinsViewCacheTest,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::CCoinsViewCacheTest,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>_>_>
              *)in_stack_fffffffffffff028);
      std::
      unique_ptr<(anonymous_namespace)::CCoinsViewCacheTest,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>
      ::operator*((unique_ptr<(anonymous_namespace)::CCoinsViewCacheTest,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>
                   *)in_stack_fffffffffffff038);
      AccessByTxid(in_stack_fffffffffffff038,
                   (Txid *)CONCAT44(in_stack_fffffffffffff034,in_stack_fffffffffffff030));
    }
    else {
      std::
      vector<std::unique_ptr<(anonymous_namespace)::CCoinsViewCacheTest,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::CCoinsViewCacheTest,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>_>_>
      ::back((vector<std::unique_ptr<(anonymous_namespace)::CCoinsViewCacheTest,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::CCoinsViewCacheTest,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>_>_>
              *)in_stack_fffffffffffff028);
      std::
      unique_ptr<(anonymous_namespace)::CCoinsViewCacheTest,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>
      ::operator->((unique_ptr<(anonymous_namespace)::CCoinsViewCacheTest,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>
                    *)in_stack_fffffffffffff028);
      COutPoint::COutPoint
                ((COutPoint *)in_stack_fffffffffffff038,
                 (Txid *)CONCAT44(in_stack_fffffffffffff034,in_stack_fffffffffffff030),
                 (uint32_t)((ulong)in_stack_fffffffffffff028 >> 0x20));
      CCoinsViewCache::AccessCoin
                (in_stack_fffffffffffff038,
                 (COutPoint *)CONCAT44(in_stack_fffffffffffff034,in_stack_fffffffffffff030));
    }
    do {
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)in_stack_fffffffffffff038,
                 (pointer)CONCAT44(in_stack_fffffffffffff034,in_stack_fffffffffffff030),
                 (unsigned_long)in_stack_fffffffffffff028);
      boost::unit_test::basic_cstring<const_char>::basic_cstring
                ((basic_cstring<const_char> *)in_stack_fffffffffffff028);
      boost::unit_test::unit_test_log_t::set_checkpoint
                (in_stack_fffffffffffff068,(const_string *)in_stack_fffffffffffff060,
                 CONCAT17(in_stack_fffffffffffff05f,in_stack_fffffffffffff058),
                 (const_string *)in_stack_fffffffffffff050);
      anon_unknown.dwarf_34a75b::operator==
                ((Coin *)CONCAT44(in_stack_fffffffffffff034,in_stack_fffffffffffff030),
                 (Coin *)in_stack_fffffffffffff028);
      boost::test_tools::assertion_result::assertion_result
                ((assertion_result *)in_stack_fffffffffffff038,
                 SUB41(in_stack_fffffffffffff034 >> 0x18,0));
      boost::unit_test::lazy_ostream::instance();
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)in_stack_fffffffffffff038,
                 (pointer)CONCAT44(in_stack_fffffffffffff034,in_stack_fffffffffffff030),
                 (unsigned_long)in_stack_fffffffffffff028);
      boost::unit_test::operator<<
                ((lazy_ostream *)CONCAT44(in_stack_fffffffffffff034,in_stack_fffffffffffff030),
                 (basic_cstring<const_char> *)in_stack_fffffffffffff028);
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)in_stack_fffffffffffff038,
                 (pointer)CONCAT44(in_stack_fffffffffffff034,in_stack_fffffffffffff030),
                 (unsigned_long)in_stack_fffffffffffff028);
      in_stack_fffffffffffff028 = (CCoinsViewCache *)0x0;
      boost::test_tools::tt_detail::report_assertion
                (local_280,local_2a0,local_2c0,0xae,CHECK,CHECK_PRED);
      boost::unit_test::
      lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
      ::~lazy_ostream_impl
                ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                  *)in_stack_fffffffffffff028);
      boost::test_tools::assertion_result::~assertion_result
                ((assertion_result *)in_stack_fffffffffffff028);
      bVar1 = boost::test_tools::tt_detail::dummy_cond();
    } while (bVar1);
    if (uVar5 == 0) {
      do {
        boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                  ((basic_cstring<const_char> *)in_stack_fffffffffffff038,
                   (pointer)CONCAT44(in_stack_fffffffffffff034,in_stack_fffffffffffff030),
                   (unsigned_long)in_stack_fffffffffffff028);
        boost::unit_test::basic_cstring<const_char>::basic_cstring
                  ((basic_cstring<const_char> *)in_stack_fffffffffffff028);
        boost::unit_test::unit_test_log_t::set_checkpoint
                  (in_stack_fffffffffffff068,(const_string *)in_stack_fffffffffffff060,
                   CONCAT17(in_stack_fffffffffffff05f,in_stack_fffffffffffff058),
                   (const_string *)in_stack_fffffffffffff050);
        Coin::IsSpent((Coin *)in_stack_fffffffffffff028);
        boost::test_tools::assertion_result::assertion_result
                  ((assertion_result *)in_stack_fffffffffffff038,
                   SUB41(in_stack_fffffffffffff034 >> 0x18,0));
        boost::unit_test::lazy_ostream::instance();
        boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                  ((basic_cstring<const_char> *)in_stack_fffffffffffff038,
                   (pointer)CONCAT44(in_stack_fffffffffffff034,in_stack_fffffffffffff030),
                   (unsigned_long)in_stack_fffffffffffff028);
        boost::unit_test::operator<<
                  ((lazy_ostream *)CONCAT44(in_stack_fffffffffffff034,in_stack_fffffffffffff030),
                   (basic_cstring<const_char> *)in_stack_fffffffffffff028);
        boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                  ((basic_cstring<const_char> *)in_stack_fffffffffffff038,
                   (pointer)CONCAT44(in_stack_fffffffffffff034,in_stack_fffffffffffff030),
                   (unsigned_long)in_stack_fffffffffffff028);
        in_stack_fffffffffffff028 = (CCoinsViewCache *)0x0;
        boost::test_tools::tt_detail::report_assertion
                  (local_2f8,local_318,local_338,0xb1,CHECK,CHECK_PRED);
        boost::unit_test::
        lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
        ::~lazy_ostream_impl
                  ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                    *)in_stack_fffffffffffff028);
        boost::test_tools::assertion_result::~assertion_result
                  ((assertion_result *)in_stack_fffffffffffff028);
        bVar1 = boost::test_tools::tt_detail::dummy_cond();
      } while (bVar1);
    }
    if (uVar6 == 0) {
      std::
      vector<std::unique_ptr<(anonymous_namespace)::CCoinsViewCacheTest,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::CCoinsViewCacheTest,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>_>_>
      ::back((vector<std::unique_ptr<(anonymous_namespace)::CCoinsViewCacheTest,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::CCoinsViewCacheTest,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>_>_>
              *)in_stack_fffffffffffff028);
      pCVar7 = std::
               unique_ptr<(anonymous_namespace)::CCoinsViewCacheTest,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>
               ::operator->((unique_ptr<(anonymous_namespace)::CCoinsViewCacheTest,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>
                             *)in_stack_fffffffffffff028);
      COutPoint::COutPoint
                ((COutPoint *)in_stack_fffffffffffff038,
                 (Txid *)CONCAT44(in_stack_fffffffffffff034,in_stack_fffffffffffff030),
                 (uint32_t)((ulong)in_stack_fffffffffffff028 >> 0x20));
      (*(pCVar7->super_CCoinsViewCache).super_CCoinsViewBacked.super_CCoinsView._vptr_CCoinsView[1])
                (pCVar7,local_128);
      do {
        boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                  ((basic_cstring<const_char> *)in_stack_fffffffffffff038,
                   (pointer)CONCAT44(in_stack_fffffffffffff034,in_stack_fffffffffffff030),
                   (unsigned_long)in_stack_fffffffffffff028);
        boost::unit_test::basic_cstring<const_char>::basic_cstring
                  ((basic_cstring<const_char> *)in_stack_fffffffffffff028);
        boost::unit_test::unit_test_log_t::set_checkpoint
                  (in_stack_fffffffffffff068,(const_string *)in_stack_fffffffffffff060,
                   CONCAT17(in_stack_fffffffffffff05f,in_stack_fffffffffffff058),
                   (const_string *)in_stack_fffffffffffff050);
        Coin::IsSpent((Coin *)in_stack_fffffffffffff028);
        boost::test_tools::assertion_result::assertion_result
                  ((assertion_result *)in_stack_fffffffffffff038,
                   SUB41(in_stack_fffffffffffff034 >> 0x18,0));
        boost::unit_test::lazy_ostream::instance();
        boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                  ((basic_cstring<const_char> *)in_stack_fffffffffffff038,
                   (pointer)CONCAT44(in_stack_fffffffffffff034,in_stack_fffffffffffff030),
                   (unsigned_long)in_stack_fffffffffffff028);
        boost::unit_test::operator<<
                  ((lazy_ostream *)CONCAT44(in_stack_fffffffffffff034,in_stack_fffffffffffff030),
                   (basic_cstring<const_char> *)in_stack_fffffffffffff028);
        boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                  ((basic_cstring<const_char> *)in_stack_fffffffffffff038,
                   (pointer)CONCAT44(in_stack_fffffffffffff034,in_stack_fffffffffffff030),
                   (unsigned_long)in_stack_fffffffffffff028);
        in_stack_fffffffffffff028 = (CCoinsViewCache *)0x0;
        boost::test_tools::tt_detail::report_assertion
                  (local_370,local_390,local_3b0,0xb6,CHECK,CHECK_PRED);
        boost::unit_test::
        lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
        ::~lazy_ostream_impl
                  ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                    *)in_stack_fffffffffffff028);
        boost::test_tools::assertion_result::~assertion_result
                  ((assertion_result *)in_stack_fffffffffffff028);
        bVar1 = boost::test_tools::tt_detail::dummy_cond();
      } while (bVar1);
    }
    iVar2 = RandomMixin<FastRandomContext>::randrange<int>
                      ((RandomMixin<FastRandomContext> *)in_stack_fffffffffffff050,
                       (int)((ulong)in_stack_fffffffffffff048 >> 0x20));
    if ((iVar2 == 0) || (bVar1 = Coin::IsSpent((Coin *)in_stack_fffffffffffff028), bVar1)) {
      Coin::Coin((Coin *)in_stack_fffffffffffff028);
      local_158 = RandMoney<FastRandomContext_&>((FastRandomContext *)in_stack_fffffffffffff028);
      local_130 = local_130 & 1 | 2;
      iVar2 = RandomMixin<FastRandomContext>::randrange<int>
                        ((RandomMixin<FastRandomContext> *)in_stack_fffffffffffff050,
                         (int)((ulong)in_stack_fffffffffffff048 >> 0x20));
      if ((iVar2 == 0) && (bVar1 = Coin::IsSpent((Coin *)in_stack_fffffffffffff028), bVar1)) {
        RandomMixin<FastRandomContext>::randbits
                  ((RandomMixin<FastRandomContext> *)in_stack_fffffffffffff048,
                   in_stack_fffffffffffff044);
        local_3b1 = 0x6a;
        prevector<28U,_unsigned_char,_unsigned_int,_int>::assign
                  ((prevector<28U,_unsigned_char,_unsigned_int,_int> *)in_stack_fffffffffffff038,
                   in_stack_fffffffffffff034,(uchar *)in_stack_fffffffffffff028);
        do {
          boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                    ((basic_cstring<const_char> *)in_stack_fffffffffffff038,
                     (pointer)CONCAT44(in_stack_fffffffffffff034,in_stack_fffffffffffff030),
                     (unsigned_long)in_stack_fffffffffffff028);
          boost::unit_test::basic_cstring<const_char>::basic_cstring
                    ((basic_cstring<const_char> *)in_stack_fffffffffffff028);
          boost::unit_test::unit_test_log_t::set_checkpoint
                    (in_stack_fffffffffffff068,(const_string *)in_stack_fffffffffffff060,
                     CONCAT17(in_stack_fffffffffffff05f,in_stack_fffffffffffff058),
                     (const_string *)in_stack_fffffffffffff050);
          CScript::IsUnspendable
                    ((CScript *)CONCAT44(in_stack_fffffffffffff034,in_stack_fffffffffffff030));
          boost::test_tools::assertion_result::assertion_result
                    ((assertion_result *)in_stack_fffffffffffff038,
                     SUB41(in_stack_fffffffffffff034 >> 0x18,0));
          boost::unit_test::lazy_ostream::instance();
          boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                    ((basic_cstring<const_char> *)in_stack_fffffffffffff038,
                     (pointer)CONCAT44(in_stack_fffffffffffff034,in_stack_fffffffffffff030),
                     (unsigned_long)in_stack_fffffffffffff028);
          boost::unit_test::operator<<
                    ((lazy_ostream *)CONCAT44(in_stack_fffffffffffff034,in_stack_fffffffffffff030),
                     (basic_cstring<const_char> *)in_stack_fffffffffffff028);
          boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                    ((basic_cstring<const_char> *)in_stack_fffffffffffff038,
                     (pointer)CONCAT44(in_stack_fffffffffffff034,in_stack_fffffffffffff030),
                     (unsigned_long)in_stack_fffffffffffff028);
          in_stack_fffffffffffff028 = (CCoinsViewCache *)0x0;
          boost::test_tools::tt_detail::report_assertion
                    (local_3f0,local_410,local_430,0xc1,CHECK,CHECK_PRED);
          boost::unit_test::
          lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
          ::~lazy_ostream_impl
                    ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                      *)in_stack_fffffffffffff028);
          boost::test_tools::assertion_result::~assertion_result
                    ((assertion_result *)in_stack_fffffffffffff028);
          bVar1 = boost::test_tools::tt_detail::dummy_cond();
        } while (bVar1);
        local_bf7[2] = 1;
      }
      else {
        RandomMixin<FastRandomContext>::randbits
                  ((RandomMixin<FastRandomContext> *)in_stack_fffffffffffff048,
                   in_stack_fffffffffffff044);
        local_431 = 0;
        prevector<28U,_unsigned_char,_unsigned_int,_int>::assign
                  ((prevector<28U,_unsigned_char,_unsigned_int,_int> *)in_stack_fffffffffffff038,
                   in_stack_fffffffffffff034,(uchar *)in_stack_fffffffffffff028);
        bVar1 = Coin::IsSpent((Coin *)in_stack_fffffffffffff028);
        if (bVar1) {
          local_da0 = local_bf7 + 3;
        }
        else {
          local_da0 = local_bf7;
        }
        *local_da0 = 1;
        Coin::operator=((Coin *)in_stack_fffffffffffff038,
                        (Coin *)CONCAT44(in_stack_fffffffffffff034,in_stack_fffffffffffff030));
      }
      bVar1 = Coin::IsSpent((Coin *)in_stack_fffffffffffff028);
      if (bVar1) {
        RandomMixin<FastRandomContext>::rand32
                  ((RandomMixin<FastRandomContext> *)in_stack_fffffffffffff028);
      }
      std::
      vector<std::unique_ptr<(anonymous_namespace)::CCoinsViewCacheTest,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::CCoinsViewCacheTest,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>_>_>
      ::back((vector<std::unique_ptr<(anonymous_namespace)::CCoinsViewCacheTest,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::CCoinsViewCacheTest,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>_>_>
              *)in_stack_fffffffffffff028);
      std::
      unique_ptr<(anonymous_namespace)::CCoinsViewCacheTest,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>
      ::operator->((unique_ptr<(anonymous_namespace)::CCoinsViewCacheTest,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>
                    *)in_stack_fffffffffffff028);
      COutPoint::COutPoint
                ((COutPoint *)in_stack_fffffffffffff038,
                 (Txid *)CONCAT44(in_stack_fffffffffffff034,in_stack_fffffffffffff030),
                 (uint32_t)((ulong)in_stack_fffffffffffff028 >> 0x20));
      CCoinsViewCache::AddCoin
                ((CCoinsViewCache *)CONCAT17(in_stack_fffffffffffff08f,in_stack_fffffffffffff088),
                 in_stack_fffffffffffff080,in_stack_fffffffffffff078,(bool)in_stack_fffffffffffff077
                );
      Coin::~Coin((Coin *)in_stack_fffffffffffff028);
    }
    else {
      local_bf7[1] = 1;
      Coin::Clear((Coin *)in_stack_fffffffffffff028);
      do {
        boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                  ((basic_cstring<const_char> *)in_stack_fffffffffffff038,
                   (pointer)CONCAT44(in_stack_fffffffffffff034,in_stack_fffffffffffff030),
                   (unsigned_long)in_stack_fffffffffffff028);
        boost::unit_test::basic_cstring<const_char>::basic_cstring
                  ((basic_cstring<const_char> *)in_stack_fffffffffffff028);
        boost::unit_test::unit_test_log_t::set_checkpoint
                  (in_stack_fffffffffffff068,(const_string *)in_stack_fffffffffffff060,
                   CONCAT17(in_stack_fffffffffffff05f,in_stack_fffffffffffff058),
                   (const_string *)in_stack_fffffffffffff050);
        std::
        vector<std::unique_ptr<(anonymous_namespace)::CCoinsViewCacheTest,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::CCoinsViewCacheTest,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>_>_>
        ::back((vector<std::unique_ptr<(anonymous_namespace)::CCoinsViewCacheTest,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::CCoinsViewCacheTest,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>_>_>
                *)in_stack_fffffffffffff028);
        std::
        unique_ptr<(anonymous_namespace)::CCoinsViewCacheTest,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>
        ::operator->((unique_ptr<(anonymous_namespace)::CCoinsViewCacheTest,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>
                      *)in_stack_fffffffffffff028);
        COutPoint::COutPoint
                  ((COutPoint *)in_stack_fffffffffffff038,
                   (Txid *)CONCAT44(in_stack_fffffffffffff034,in_stack_fffffffffffff030),
                   (uint32_t)((ulong)in_stack_fffffffffffff028 >> 0x20));
        CCoinsViewCache::SpendCoin
                  ((CCoinsViewCache *)CONCAT17(in_stack_fffffffffffff05f,in_stack_fffffffffffff058),
                   in_stack_fffffffffffff050,(Coin *)in_stack_fffffffffffff048);
        boost::test_tools::assertion_result::assertion_result
                  ((assertion_result *)in_stack_fffffffffffff038,
                   SUB41(in_stack_fffffffffffff034 >> 0x18,0));
        boost::unit_test::lazy_ostream::instance();
        boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                  ((basic_cstring<const_char> *)in_stack_fffffffffffff038,
                   (pointer)CONCAT44(in_stack_fffffffffffff034,in_stack_fffffffffffff030),
                   (unsigned_long)in_stack_fffffffffffff028);
        boost::unit_test::operator<<
                  ((lazy_ostream *)CONCAT44(in_stack_fffffffffffff034,in_stack_fffffffffffff030),
                   (basic_cstring<const_char> *)in_stack_fffffffffffff028);
        boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                  ((basic_cstring<const_char> *)in_stack_fffffffffffff038,
                   (pointer)CONCAT44(in_stack_fffffffffffff034,in_stack_fffffffffffff030),
                   (unsigned_long)in_stack_fffffffffffff028);
        in_stack_fffffffffffff028 = (CCoinsViewCache *)0x0;
        boost::test_tools::tt_detail::report_assertion
                  (local_470,local_490,local_4b0,0xcf,CHECK,CHECK_PRED);
        boost::unit_test::
        lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
        ::~lazy_ostream_impl
                  ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                    *)in_stack_fffffffffffff028);
        boost::test_tools::assertion_result::~assertion_result
                  ((assertion_result *)in_stack_fffffffffffff028);
        bVar1 = boost::test_tools::tt_detail::dummy_cond();
      } while (bVar1);
    }
    iVar2 = RandomMixin<FastRandomContext>::randrange<int>
                      ((RandomMixin<FastRandomContext> *)in_stack_fffffffffffff050,
                       (int)((ulong)in_stack_fffffffffffff048 >> 0x20));
    if (iVar2 == 0) {
      RandomMixin<FastRandomContext>::rand32
                ((RandomMixin<FastRandomContext> *)in_stack_fffffffffffff028);
      std::vector<transaction_identifier<false>,_std::allocator<transaction_identifier<false>_>_>::
      size((vector<transaction_identifier<false>,_std::allocator<transaction_identifier<false>_>_> *
           )in_stack_fffffffffffff028);
      std::vector<transaction_identifier<false>,_std::allocator<transaction_identifier<false>_>_>::
      operator[]((vector<transaction_identifier<false>,_std::allocator<transaction_identifier<false>_>_>
                  *)in_stack_fffffffffffff038,
                 CONCAT44(in_stack_fffffffffffff034,in_stack_fffffffffffff030));
      COutPoint::COutPoint
                ((COutPoint *)in_stack_fffffffffffff038,
                 (Txid *)CONCAT44(in_stack_fffffffffffff034,in_stack_fffffffffffff030),
                 (uint32_t)((ulong)in_stack_fffffffffffff028 >> 0x20));
      RandomMixin<FastRandomContext>::rand32
                ((RandomMixin<FastRandomContext> *)in_stack_fffffffffffff028);
      std::
      vector<std::unique_ptr<(anonymous_namespace)::CCoinsViewCacheTest,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::CCoinsViewCacheTest,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>_>_>
      ::size((vector<std::unique_ptr<(anonymous_namespace)::CCoinsViewCacheTest,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::CCoinsViewCacheTest,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>_>_>
              *)in_stack_fffffffffffff028);
      std::
      vector<std::unique_ptr<(anonymous_namespace)::CCoinsViewCacheTest,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::CCoinsViewCacheTest,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>_>_>
      ::operator[]((vector<std::unique_ptr<(anonymous_namespace)::CCoinsViewCacheTest,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::CCoinsViewCacheTest,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>_>_>
                    *)in_stack_fffffffffffff038,
                   CONCAT44(in_stack_fffffffffffff034,in_stack_fffffffffffff030));
      std::
      unique_ptr<(anonymous_namespace)::CCoinsViewCacheTest,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>
      ::operator->((unique_ptr<(anonymous_namespace)::CCoinsViewCacheTest,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>
                    *)in_stack_fffffffffffff028);
      CCoinsViewCache::Uncache
                ((CCoinsViewCache *)CONCAT44(in_stack_fffffffffffff044,in_stack_fffffffffffff040),
                 (COutPoint *)in_stack_fffffffffffff038);
      std::
      vector<std::unique_ptr<(anonymous_namespace)::CCoinsViewCacheTest,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::CCoinsViewCacheTest,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>_>_>
      ::operator[]((vector<std::unique_ptr<(anonymous_namespace)::CCoinsViewCacheTest,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::CCoinsViewCacheTest,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>_>_>
                    *)in_stack_fffffffffffff038,
                   CONCAT44(in_stack_fffffffffffff034,in_stack_fffffffffffff030));
      std::
      unique_ptr<(anonymous_namespace)::CCoinsViewCacheTest,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>
      ::operator->((unique_ptr<(anonymous_namespace)::CCoinsViewCacheTest,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>
                    *)in_stack_fffffffffffff028);
      CCoinsViewCache::HaveCoinInCache
                ((CCoinsViewCache *)CONCAT44(in_stack_fffffffffffff044,in_stack_fffffffffffff040),
                 (COutPoint *)in_stack_fffffffffffff038);
    }
    iVar2 = RandomMixin<FastRandomContext>::randrange<int>
                      ((RandomMixin<FastRandomContext> *)in_stack_fffffffffffff050,
                       (int)((ulong)in_stack_fffffffffffff048 >> 0x20));
    if ((iVar2 == 1) || (local_c14 == 39999)) {
      local_4b8 = (_Base_ptr)
                  std::
                  map<COutPoint,_Coin,_std::less<COutPoint>,_std::allocator<std::pair<const_COutPoint,_Coin>_>_>
                  ::begin((map<COutPoint,_Coin,_std::less<COutPoint>,_std::allocator<std::pair<const_COutPoint,_Coin>_>_>
                           *)CONCAT44(in_stack_fffffffffffff034,in_stack_fffffffffffff030));
      local_4c0 = (_Base_ptr)
                  std::
                  map<COutPoint,_Coin,_std::less<COutPoint>,_std::allocator<std::pair<const_COutPoint,_Coin>_>_>
                  ::end((map<COutPoint,_Coin,_std::less<COutPoint>,_std::allocator<std::pair<const_COutPoint,_Coin>_>_>
                         *)CONCAT44(in_stack_fffffffffffff034,in_stack_fffffffffffff030));
      while (bVar1 = std::operator==((_Self *)in_stack_fffffffffffff038,
                                     (_Self *)CONCAT44(in_stack_fffffffffffff034,
                                                       in_stack_fffffffffffff030)),
            ((bVar1 ^ 0xffU) & 1) != 0) {
        ppVar8 = std::_Rb_tree_iterator<std::pair<const_COutPoint,_Coin>_>::operator*
                           ((_Rb_tree_iterator<std::pair<const_COutPoint,_Coin>_> *)
                            in_stack_fffffffffffff028);
        std::
        vector<std::unique_ptr<(anonymous_namespace)::CCoinsViewCacheTest,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::CCoinsViewCacheTest,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>_>_>
        ::back((vector<std::unique_ptr<(anonymous_namespace)::CCoinsViewCacheTest,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::CCoinsViewCacheTest,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>_>_>
                *)in_stack_fffffffffffff028);
        pCVar7 = std::
                 unique_ptr<(anonymous_namespace)::CCoinsViewCacheTest,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>
                 ::operator->((unique_ptr<(anonymous_namespace)::CCoinsViewCacheTest,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>
                               *)in_stack_fffffffffffff028);
        (*(pCVar7->super_CCoinsViewCache).super_CCoinsViewBacked.super_CCoinsView._vptr_CCoinsView
          [1])(pCVar7,ppVar8);
        std::
        vector<std::unique_ptr<(anonymous_namespace)::CCoinsViewCacheTest,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::CCoinsViewCacheTest,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>_>_>
        ::back((vector<std::unique_ptr<(anonymous_namespace)::CCoinsViewCacheTest,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::CCoinsViewCacheTest,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>_>_>
                *)in_stack_fffffffffffff028);
        std::
        unique_ptr<(anonymous_namespace)::CCoinsViewCacheTest,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>
        ::operator->((unique_ptr<(anonymous_namespace)::CCoinsViewCacheTest,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>
                      *)in_stack_fffffffffffff028);
        CCoinsViewCache::AccessCoin
                  (in_stack_fffffffffffff038,
                   (COutPoint *)CONCAT44(in_stack_fffffffffffff034,in_stack_fffffffffffff030));
        do {
          boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                    ((basic_cstring<const_char> *)in_stack_fffffffffffff038,
                     (pointer)CONCAT44(in_stack_fffffffffffff034,in_stack_fffffffffffff030),
                     (unsigned_long)in_stack_fffffffffffff028);
          boost::unit_test::basic_cstring<const_char>::basic_cstring
                    ((basic_cstring<const_char> *)in_stack_fffffffffffff028);
          boost::unit_test::unit_test_log_t::set_checkpoint
                    (in_stack_fffffffffffff068,(const_string *)in_stack_fffffffffffff060,
                     CONCAT17(in_stack_fffffffffffff05f,in_stack_fffffffffffff058),
                     (const_string *)in_stack_fffffffffffff050);
          Coin::IsSpent((Coin *)in_stack_fffffffffffff028);
          boost::test_tools::assertion_result::assertion_result
                    ((assertion_result *)in_stack_fffffffffffff038,
                     SUB41(in_stack_fffffffffffff034 >> 0x18,0));
          boost::unit_test::lazy_ostream::instance();
          boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                    ((basic_cstring<const_char> *)in_stack_fffffffffffff038,
                     (pointer)CONCAT44(in_stack_fffffffffffff034,in_stack_fffffffffffff030),
                     (unsigned_long)in_stack_fffffffffffff028);
          boost::unit_test::operator<<
                    ((lazy_ostream *)CONCAT44(in_stack_fffffffffffff034,in_stack_fffffffffffff030),
                     (basic_cstring<const_char> *)in_stack_fffffffffffff028);
          boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                    ((basic_cstring<const_char> *)in_stack_fffffffffffff038,
                     (pointer)CONCAT44(in_stack_fffffffffffff034,in_stack_fffffffffffff030),
                     (unsigned_long)in_stack_fffffffffffff028);
          in_stack_fffffffffffff028 = (CCoinsViewCache *)0x0;
          boost::test_tools::tt_detail::report_assertion
                    (local_4f8,local_518,local_538,0xe0,CHECK,CHECK_PRED);
          boost::unit_test::
          lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
          ::~lazy_ostream_impl
                    ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                      *)in_stack_fffffffffffff028);
          boost::test_tools::assertion_result::~assertion_result
                    ((assertion_result *)in_stack_fffffffffffff028);
          bVar1 = boost::test_tools::tt_detail::dummy_cond();
        } while (bVar1);
        do {
          boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                    ((basic_cstring<const_char> *)in_stack_fffffffffffff038,
                     (pointer)CONCAT44(in_stack_fffffffffffff034,in_stack_fffffffffffff030),
                     (unsigned_long)in_stack_fffffffffffff028);
          boost::unit_test::basic_cstring<const_char>::basic_cstring
                    ((basic_cstring<const_char> *)in_stack_fffffffffffff028);
          boost::unit_test::unit_test_log_t::set_checkpoint
                    (in_stack_fffffffffffff068,(const_string *)in_stack_fffffffffffff060,
                     CONCAT17(in_stack_fffffffffffff05f,in_stack_fffffffffffff058),
                     (const_string *)in_stack_fffffffffffff050);
          anon_unknown.dwarf_34a75b::operator==
                    ((Coin *)CONCAT44(in_stack_fffffffffffff034,in_stack_fffffffffffff030),
                     (Coin *)in_stack_fffffffffffff028);
          boost::test_tools::assertion_result::assertion_result
                    ((assertion_result *)in_stack_fffffffffffff038,
                     SUB41(in_stack_fffffffffffff034 >> 0x18,0));
          boost::unit_test::lazy_ostream::instance();
          boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                    ((basic_cstring<const_char> *)in_stack_fffffffffffff038,
                     (pointer)CONCAT44(in_stack_fffffffffffff034,in_stack_fffffffffffff030),
                     (unsigned_long)in_stack_fffffffffffff028);
          boost::unit_test::operator<<
                    ((lazy_ostream *)CONCAT44(in_stack_fffffffffffff034,in_stack_fffffffffffff030),
                     (basic_cstring<const_char> *)in_stack_fffffffffffff028);
          boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                    ((basic_cstring<const_char> *)in_stack_fffffffffffff038,
                     (pointer)CONCAT44(in_stack_fffffffffffff034,in_stack_fffffffffffff030),
                     (unsigned_long)in_stack_fffffffffffff028);
          in_stack_fffffffffffff028 = (CCoinsViewCache *)0x0;
          boost::test_tools::tt_detail::report_assertion
                    (local_570,local_590,local_5b0,0xe1,CHECK,CHECK_PRED);
          boost::unit_test::
          lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
          ::~lazy_ostream_impl
                    ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                      *)in_stack_fffffffffffff028);
          boost::test_tools::assertion_result::~assertion_result
                    ((assertion_result *)in_stack_fffffffffffff028);
          bVar1 = boost::test_tools::tt_detail::dummy_cond();
        } while (bVar1);
        bVar1 = Coin::IsSpent((Coin *)in_stack_fffffffffffff028);
        if (!bVar1) {
          do {
            boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                      ((basic_cstring<const_char> *)in_stack_fffffffffffff038,
                       (pointer)CONCAT44(in_stack_fffffffffffff034,in_stack_fffffffffffff030),
                       (unsigned_long)in_stack_fffffffffffff028);
            boost::unit_test::basic_cstring<const_char>::basic_cstring
                      ((basic_cstring<const_char> *)in_stack_fffffffffffff028);
            boost::unit_test::unit_test_log_t::set_checkpoint
                      (in_stack_fffffffffffff068,(const_string *)in_stack_fffffffffffff060,
                       CONCAT17(in_stack_fffffffffffff05f,in_stack_fffffffffffff058),
                       (const_string *)in_stack_fffffffffffff050);
            std::
            vector<std::unique_ptr<(anonymous_namespace)::CCoinsViewCacheTest,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::CCoinsViewCacheTest,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>_>_>
            ::back((vector<std::unique_ptr<(anonymous_namespace)::CCoinsViewCacheTest,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::CCoinsViewCacheTest,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>_>_>
                    *)in_stack_fffffffffffff028);
            std::
            unique_ptr<(anonymous_namespace)::CCoinsViewCacheTest,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>
            ::operator->((unique_ptr<(anonymous_namespace)::CCoinsViewCacheTest,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>
                          *)in_stack_fffffffffffff028);
            CCoinsViewCache::HaveCoinInCache
                      ((CCoinsViewCache *)
                       CONCAT44(in_stack_fffffffffffff044,in_stack_fffffffffffff040),
                       (COutPoint *)in_stack_fffffffffffff038);
            boost::test_tools::assertion_result::assertion_result
                      ((assertion_result *)in_stack_fffffffffffff038,
                       SUB41(in_stack_fffffffffffff034 >> 0x18,0));
            boost::unit_test::lazy_ostream::instance();
            boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                      ((basic_cstring<const_char> *)in_stack_fffffffffffff038,
                       (pointer)CONCAT44(in_stack_fffffffffffff034,in_stack_fffffffffffff030),
                       (unsigned_long)in_stack_fffffffffffff028);
            boost::unit_test::operator<<
                      ((lazy_ostream *)CONCAT44(in_stack_fffffffffffff034,in_stack_fffffffffffff030)
                       ,(basic_cstring<const_char> *)in_stack_fffffffffffff028);
            boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                      ((basic_cstring<const_char> *)in_stack_fffffffffffff038,
                       (pointer)CONCAT44(in_stack_fffffffffffff034,in_stack_fffffffffffff030),
                       (unsigned_long)in_stack_fffffffffffff028);
            in_stack_fffffffffffff028 = (CCoinsViewCache *)0x0;
            boost::test_tools::tt_detail::report_assertion
                      (local_5e8,local_608,local_628,0xe5,CHECK,CHECK_PRED);
            boost::unit_test::
            lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
            ::~lazy_ostream_impl
                      ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                        *)in_stack_fffffffffffff028);
            boost::test_tools::assertion_result::~assertion_result
                      ((assertion_result *)in_stack_fffffffffffff028);
            bVar1 = boost::test_tools::tt_detail::dummy_cond();
          } while (bVar1);
        }
        std::_Rb_tree_iterator<std::pair<const_COutPoint,_Coin>_>::operator++
                  ((_Rb_tree_iterator<std::pair<const_COutPoint,_Coin>_> *)in_stack_fffffffffffff028
                  );
      }
      local_630 = (unique_ptr<(anonymous_namespace)::CCoinsViewCacheTest,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>
                   *)std::
                     vector<std::unique_ptr<(anonymous_namespace)::CCoinsViewCacheTest,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::CCoinsViewCacheTest,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>_>_>
                     ::begin((vector<std::unique_ptr<(anonymous_namespace)::CCoinsViewCacheTest,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::CCoinsViewCacheTest,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>_>_>
                              *)CONCAT44(in_stack_fffffffffffff034,in_stack_fffffffffffff030));
      local_638 = (unique_ptr<(anonymous_namespace)::CCoinsViewCacheTest,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>
                   *)std::
                     vector<std::unique_ptr<(anonymous_namespace)::CCoinsViewCacheTest,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::CCoinsViewCacheTest,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>_>_>
                     ::end((vector<std::unique_ptr<(anonymous_namespace)::CCoinsViewCacheTest,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::CCoinsViewCacheTest,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>_>_>
                            *)CONCAT44(in_stack_fffffffffffff034,in_stack_fffffffffffff030));
      while (bVar1 = __gnu_cxx::
                     operator==<std::unique_ptr<(anonymous_namespace)::CCoinsViewCacheTest,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>_*,_std::vector<std::unique_ptr<(anonymous_namespace)::CCoinsViewCacheTest,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::CCoinsViewCacheTest,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>_>_>_>
                               ((__normal_iterator<std::unique_ptr<(anonymous_namespace)::CCoinsViewCacheTest,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>_*,_std::vector<std::unique_ptr<(anonymous_namespace)::CCoinsViewCacheTest,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::CCoinsViewCacheTest,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>_>_>_>
                                 *)in_stack_fffffffffffff038,
                                (__normal_iterator<std::unique_ptr<(anonymous_namespace)::CCoinsViewCacheTest,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>_*,_std::vector<std::unique_ptr<(anonymous_namespace)::CCoinsViewCacheTest,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::CCoinsViewCacheTest,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>_>_>_>
                                 *)CONCAT44(in_stack_fffffffffffff034,in_stack_fffffffffffff030)),
            ((bVar1 ^ 0xffU) & 1) != 0) {
        __gnu_cxx::
        __normal_iterator<std::unique_ptr<(anonymous_namespace)::CCoinsViewCacheTest,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>_*,_std::vector<std::unique_ptr<(anonymous_namespace)::CCoinsViewCacheTest,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::CCoinsViewCacheTest,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>_>_>_>
        ::operator*((__normal_iterator<std::unique_ptr<(anonymous_namespace)::CCoinsViewCacheTest,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>_*,_std::vector<std::unique_ptr<(anonymous_namespace)::CCoinsViewCacheTest,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::CCoinsViewCacheTest,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>_>_>_>
                     *)in_stack_fffffffffffff028);
        std::
        unique_ptr<(anonymous_namespace)::CCoinsViewCacheTest,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>
        ::operator->((unique_ptr<(anonymous_namespace)::CCoinsViewCacheTest,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>
                      *)in_stack_fffffffffffff028);
        anon_unknown.dwarf_34a75b::CCoinsViewCacheTest::SelfTest
                  (in_stack_fffffffffffff0d8,(bool)in_stack_fffffffffffff0d7);
        __gnu_cxx::
        __normal_iterator<std::unique_ptr<(anonymous_namespace)::CCoinsViewCacheTest,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>_*,_std::vector<std::unique_ptr<(anonymous_namespace)::CCoinsViewCacheTest,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::CCoinsViewCacheTest,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>_>_>_>
        ::operator++((__normal_iterator<std::unique_ptr<(anonymous_namespace)::CCoinsViewCacheTest,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>_*,_std::vector<std::unique_ptr<(anonymous_namespace)::CCoinsViewCacheTest,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::CCoinsViewCacheTest,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>_>_>_>
                      *)in_stack_fffffffffffff028);
      }
    }
    iVar2 = RandomMixin<FastRandomContext>::randrange<int>
                      ((RandomMixin<FastRandomContext> *)in_stack_fffffffffffff050,
                       (int)((ulong)in_stack_fffffffffffff048 >> 0x20));
    if (((iVar2 == 0) &&
        (sVar3 = std::
                 vector<std::unique_ptr<(anonymous_namespace)::CCoinsViewCacheTest,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::CCoinsViewCacheTest,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>_>_>
                 ::size((vector<std::unique_ptr<(anonymous_namespace)::CCoinsViewCacheTest,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::CCoinsViewCacheTest,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>_>_>
                         *)in_stack_fffffffffffff028), 1 < sVar3)) &&
       (bVar1 = RandomMixin<FastRandomContext>::randbool
                          ((RandomMixin<FastRandomContext> *)in_stack_fffffffffffff028), !bVar1)) {
      std::
      vector<std::unique_ptr<(anonymous_namespace)::CCoinsViewCacheTest,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::CCoinsViewCacheTest,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>_>_>
      ::size((vector<std::unique_ptr<(anonymous_namespace)::CCoinsViewCacheTest,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::CCoinsViewCacheTest,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>_>_>
              *)in_stack_fffffffffffff028);
      RandomMixin<FastRandomContext>::randrange<unsigned_long>
                ((RandomMixin<FastRandomContext> *)in_stack_fffffffffffff050,
                 (unsigned_long)in_stack_fffffffffffff048);
      if ((local_bf7[6] & 1) != 0) {
        std::
        vector<std::unique_ptr<(anonymous_namespace)::CCoinsViewCacheTest,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::CCoinsViewCacheTest,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>_>_>
        ::operator[]((vector<std::unique_ptr<(anonymous_namespace)::CCoinsViewCacheTest,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::CCoinsViewCacheTest,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>_>_>
                      *)in_stack_fffffffffffff038,
                     CONCAT44(in_stack_fffffffffffff034,in_stack_fffffffffffff030));
        std::
        unique_ptr<(anonymous_namespace)::CCoinsViewCacheTest,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>
        ::operator->((unique_ptr<(anonymous_namespace)::CCoinsViewCacheTest,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>
                      *)in_stack_fffffffffffff028);
        RandomMixin<FastRandomContext>::rand256
                  ((RandomMixin<FastRandomContext> *)
                   CONCAT17(in_stack_fffffffffffff05f,in_stack_fffffffffffff058));
        CCoinsViewCache::SetBestBlock(in_stack_fffffffffffff028,(uint256 *)0x51c3cc);
      }
      iVar2 = RandomMixin<FastRandomContext>::randrange<int>
                        ((RandomMixin<FastRandomContext> *)in_stack_fffffffffffff050,
                         (int)((ulong)in_stack_fffffffffffff048 >> 0x20));
      do {
        boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                  ((basic_cstring<const_char> *)in_stack_fffffffffffff038,
                   (pointer)CONCAT44(in_stack_fffffffffffff034,in_stack_fffffffffffff030),
                   (unsigned_long)in_stack_fffffffffffff028);
        boost::unit_test::basic_cstring<const_char>::basic_cstring
                  ((basic_cstring<const_char> *)in_stack_fffffffffffff028);
        boost::unit_test::unit_test_log_t::set_checkpoint
                  (in_stack_fffffffffffff068,(const_string *)in_stack_fffffffffffff060,
                   CONCAT17(in_stack_fffffffffffff05f,in_stack_fffffffffffff058),
                   (const_string *)in_stack_fffffffffffff050);
        if (iVar2 < 3) {
          std::
          vector<std::unique_ptr<(anonymous_namespace)::CCoinsViewCacheTest,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::CCoinsViewCacheTest,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>_>_>
          ::operator[]((vector<std::unique_ptr<(anonymous_namespace)::CCoinsViewCacheTest,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::CCoinsViewCacheTest,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>_>_>
                        *)in_stack_fffffffffffff038,
                       CONCAT44(in_stack_fffffffffffff034,in_stack_fffffffffffff030));
          std::
          unique_ptr<(anonymous_namespace)::CCoinsViewCacheTest,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>
          ::operator->((unique_ptr<(anonymous_namespace)::CCoinsViewCacheTest,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>
                        *)in_stack_fffffffffffff028);
          CCoinsViewCache::Flush(in_stack_fffffffffffff038);
        }
        else {
          std::
          vector<std::unique_ptr<(anonymous_namespace)::CCoinsViewCacheTest,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::CCoinsViewCacheTest,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>_>_>
          ::operator[]((vector<std::unique_ptr<(anonymous_namespace)::CCoinsViewCacheTest,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::CCoinsViewCacheTest,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>_>_>
                        *)in_stack_fffffffffffff038,
                       CONCAT44(in_stack_fffffffffffff034,in_stack_fffffffffffff030));
          std::
          unique_ptr<(anonymous_namespace)::CCoinsViewCacheTest,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>
          ::operator->((unique_ptr<(anonymous_namespace)::CCoinsViewCacheTest,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>
                        *)in_stack_fffffffffffff028);
          CCoinsViewCache::Sync
                    ((CCoinsViewCache *)
                     CONCAT17(in_stack_fffffffffffff05f,in_stack_fffffffffffff058));
        }
        boost::test_tools::assertion_result::assertion_result
                  ((assertion_result *)in_stack_fffffffffffff038,
                   SUB41(in_stack_fffffffffffff034 >> 0x18,0));
        boost::unit_test::lazy_ostream::instance();
        boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                  ((basic_cstring<const_char> *)in_stack_fffffffffffff038,
                   (pointer)CONCAT44(in_stack_fffffffffffff034,in_stack_fffffffffffff030),
                   (unsigned_long)in_stack_fffffffffffff028);
        boost::unit_test::operator<<
                  ((lazy_ostream *)CONCAT44(in_stack_fffffffffffff034,in_stack_fffffffffffff030),
                   (basic_cstring<const_char> *)in_stack_fffffffffffff028);
        boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                  ((basic_cstring<const_char> *)in_stack_fffffffffffff038,
                   (pointer)CONCAT44(in_stack_fffffffffffff034,in_stack_fffffffffffff030),
                   (unsigned_long)in_stack_fffffffffffff028);
        in_stack_fffffffffffff028 = (CCoinsViewCache *)0x0;
        boost::test_tools::tt_detail::report_assertion
                  (local_670,local_690,local_6b0,0xf4,CHECK,CHECK_PRED);
        boost::unit_test::
        lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
        ::~lazy_ostream_impl
                  ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                    *)in_stack_fffffffffffff028);
        boost::test_tools::assertion_result::~assertion_result
                  ((assertion_result *)in_stack_fffffffffffff028);
        bVar1 = boost::test_tools::tt_detail::dummy_cond();
      } while (bVar1);
    }
    iVar2 = RandomMixin<FastRandomContext>::randrange<int>
                      ((RandomMixin<FastRandomContext> *)in_stack_fffffffffffff050,
                       (int)((ulong)in_stack_fffffffffffff048 >> 0x20));
    if (iVar2 == 0) {
      sVar3 = std::
              vector<std::unique_ptr<(anonymous_namespace)::CCoinsViewCacheTest,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::CCoinsViewCacheTest,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>_>_>
              ::size((vector<std::unique_ptr<(anonymous_namespace)::CCoinsViewCacheTest,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::CCoinsViewCacheTest,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>_>_>
                      *)in_stack_fffffffffffff028);
      if ((sVar3 != 0) &&
         (bVar1 = RandomMixin<FastRandomContext>::randbool
                            ((RandomMixin<FastRandomContext> *)in_stack_fffffffffffff028), !bVar1))
      {
        if ((local_bf7[6] & 1) != 0) {
          std::
          vector<std::unique_ptr<(anonymous_namespace)::CCoinsViewCacheTest,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::CCoinsViewCacheTest,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>_>_>
          ::back((vector<std::unique_ptr<(anonymous_namespace)::CCoinsViewCacheTest,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::CCoinsViewCacheTest,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>_>_>
                  *)in_stack_fffffffffffff028);
          std::
          unique_ptr<(anonymous_namespace)::CCoinsViewCacheTest,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>
          ::operator->((unique_ptr<(anonymous_namespace)::CCoinsViewCacheTest,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>
                        *)in_stack_fffffffffffff028);
          RandomMixin<FastRandomContext>::rand256
                    ((RandomMixin<FastRandomContext> *)
                     CONCAT17(in_stack_fffffffffffff05f,in_stack_fffffffffffff058));
          CCoinsViewCache::SetBestBlock(in_stack_fffffffffffff028,(uint256 *)0x51c70b);
        }
        iVar2 = RandomMixin<FastRandomContext>::randrange<int>
                          ((RandomMixin<FastRandomContext> *)in_stack_fffffffffffff050,
                           (int)((ulong)in_stack_fffffffffffff048 >> 0x20));
        do {
          boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                    ((basic_cstring<const_char> *)in_stack_fffffffffffff038,
                     (pointer)CONCAT44(in_stack_fffffffffffff034,in_stack_fffffffffffff030),
                     (unsigned_long)in_stack_fffffffffffff028);
          boost::unit_test::basic_cstring<const_char>::basic_cstring
                    ((basic_cstring<const_char> *)in_stack_fffffffffffff028);
          boost::unit_test::unit_test_log_t::set_checkpoint
                    (in_stack_fffffffffffff068,(const_string *)in_stack_fffffffffffff060,
                     CONCAT17(in_stack_fffffffffffff05f,in_stack_fffffffffffff058),
                     (const_string *)in_stack_fffffffffffff050);
          if (iVar2 < 3) {
            std::
            vector<std::unique_ptr<(anonymous_namespace)::CCoinsViewCacheTest,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::CCoinsViewCacheTest,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>_>_>
            ::back((vector<std::unique_ptr<(anonymous_namespace)::CCoinsViewCacheTest,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::CCoinsViewCacheTest,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>_>_>
                    *)in_stack_fffffffffffff028);
            std::
            unique_ptr<(anonymous_namespace)::CCoinsViewCacheTest,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>
            ::operator->((unique_ptr<(anonymous_namespace)::CCoinsViewCacheTest,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>
                          *)in_stack_fffffffffffff028);
            CCoinsViewCache::Flush(in_stack_fffffffffffff038);
          }
          else {
            std::
            vector<std::unique_ptr<(anonymous_namespace)::CCoinsViewCacheTest,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::CCoinsViewCacheTest,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>_>_>
            ::back((vector<std::unique_ptr<(anonymous_namespace)::CCoinsViewCacheTest,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::CCoinsViewCacheTest,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>_>_>
                    *)in_stack_fffffffffffff028);
            std::
            unique_ptr<(anonymous_namespace)::CCoinsViewCacheTest,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>
            ::operator->((unique_ptr<(anonymous_namespace)::CCoinsViewCacheTest,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>
                          *)in_stack_fffffffffffff028);
            CCoinsViewCache::Sync
                      ((CCoinsViewCache *)
                       CONCAT17(in_stack_fffffffffffff05f,in_stack_fffffffffffff058));
          }
          boost::test_tools::assertion_result::assertion_result
                    ((assertion_result *)in_stack_fffffffffffff038,
                     SUB41(in_stack_fffffffffffff034 >> 0x18,0));
          boost::unit_test::lazy_ostream::instance();
          boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                    ((basic_cstring<const_char> *)in_stack_fffffffffffff038,
                     (pointer)CONCAT44(in_stack_fffffffffffff034,in_stack_fffffffffffff030),
                     (unsigned_long)in_stack_fffffffffffff028);
          boost::unit_test::operator<<
                    ((lazy_ostream *)CONCAT44(in_stack_fffffffffffff034,in_stack_fffffffffffff030),
                     (basic_cstring<const_char> *)in_stack_fffffffffffff028);
          boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                    ((basic_cstring<const_char> *)in_stack_fffffffffffff038,
                     (pointer)CONCAT44(in_stack_fffffffffffff034,in_stack_fffffffffffff030),
                     (unsigned_long)in_stack_fffffffffffff028);
          in_stack_fffffffffffff028 = (CCoinsViewCache *)0x0;
          boost::test_tools::tt_detail::report_assertion
                    (local_6e8,local_708,local_728,0xfe,CHECK,CHECK_PRED);
          boost::unit_test::
          lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
          ::~lazy_ostream_impl
                    ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                      *)in_stack_fffffffffffff028);
          boost::test_tools::assertion_result::~assertion_result
                    ((assertion_result *)in_stack_fffffffffffff028);
          bVar1 = boost::test_tools::tt_detail::dummy_cond();
        } while (bVar1);
        std::
        vector<std::unique_ptr<(anonymous_namespace)::CCoinsViewCacheTest,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::CCoinsViewCacheTest,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>_>_>
        ::pop_back((vector<std::unique_ptr<(anonymous_namespace)::CCoinsViewCacheTest,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::CCoinsViewCacheTest,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>_>_>
                    *)in_stack_fffffffffffff028);
      }
      sVar3 = std::
              vector<std::unique_ptr<(anonymous_namespace)::CCoinsViewCacheTest,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::CCoinsViewCacheTest,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>_>_>
              ::size((vector<std::unique_ptr<(anonymous_namespace)::CCoinsViewCacheTest,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::CCoinsViewCacheTest,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>_>_>
                      *)in_stack_fffffffffffff028);
      if ((sVar3 == 0) ||
         ((sVar3 = std::
                   vector<std::unique_ptr<(anonymous_namespace)::CCoinsViewCacheTest,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::CCoinsViewCacheTest,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>_>_>
                   ::size((vector<std::unique_ptr<(anonymous_namespace)::CCoinsViewCacheTest,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::CCoinsViewCacheTest,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>_>_>
                           *)in_stack_fffffffffffff028), sVar3 < 4 &&
          (bVar1 = RandomMixin<FastRandomContext>::randbool
                             ((RandomMixin<FastRandomContext> *)in_stack_fffffffffffff028), bVar1)))
         ) {
        local_730 = local_210;
        sVar3 = std::
                vector<std::unique_ptr<(anonymous_namespace)::CCoinsViewCacheTest,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::CCoinsViewCacheTest,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>_>_>
                ::size((vector<std::unique_ptr<(anonymous_namespace)::CCoinsViewCacheTest,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::CCoinsViewCacheTest,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>_>_>
                        *)in_stack_fffffffffffff028);
        if (sVar3 == 0) {
          local_bf7[5] = 1;
        }
        else {
          std::
          vector<std::unique_ptr<(anonymous_namespace)::CCoinsViewCacheTest,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::CCoinsViewCacheTest,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>_>_>
          ::back((vector<std::unique_ptr<(anonymous_namespace)::CCoinsViewCacheTest,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::CCoinsViewCacheTest,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>_>_>
                  *)in_stack_fffffffffffff028);
          local_730 = std::
                      unique_ptr<(anonymous_namespace)::CCoinsViewCacheTest,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>
                      ::get((unique_ptr<(anonymous_namespace)::CCoinsViewCacheTest,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>
                             *)in_stack_fffffffffffff028);
        }
        std::make_unique<(anonymous_namespace)::CCoinsViewCacheTest,CCoinsView*&>
                  ((CCoinsView **)in_stack_fffffffffffff050);
        std::
        vector<std::unique_ptr<(anonymous_namespace)::CCoinsViewCacheTest,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::CCoinsViewCacheTest,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>_>_>
        ::push_back((vector<std::unique_ptr<(anonymous_namespace)::CCoinsViewCacheTest,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::CCoinsViewCacheTest,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>_>_>
                     *)in_stack_fffffffffffff028,(value_type *)0x51ca45);
        std::
        unique_ptr<(anonymous_namespace)::CCoinsViewCacheTest,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>
        ::~unique_ptr((unique_ptr<(anonymous_namespace)::CCoinsViewCacheTest,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>
                       *)in_stack_fffffffffffff038);
        sVar3 = std::
                vector<std::unique_ptr<(anonymous_namespace)::CCoinsViewCacheTest,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::CCoinsViewCacheTest,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>_>_>
                ::size((vector<std::unique_ptr<(anonymous_namespace)::CCoinsViewCacheTest,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::CCoinsViewCacheTest,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>_>_>
                        *)in_stack_fffffffffffff028);
        if (sVar3 == 4) {
          local_bf7[4] = 1;
        }
      }
    }
  }
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff038,
               (pointer)CONCAT44(in_stack_fffffffffffff034,in_stack_fffffffffffff030),
               (unsigned_long)in_stack_fffffffffffff028);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffff028);
    boost::unit_test::unit_test_log_t::set_checkpoint
              (in_stack_fffffffffffff068,(const_string *)in_stack_fffffffffffff060,
               CONCAT17(in_stack_fffffffffffff05f,in_stack_fffffffffffff058),
               (const_string *)in_stack_fffffffffffff050);
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)in_stack_fffffffffffff038,
               SUB41(in_stack_fffffffffffff034 >> 0x18,0));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff038,
               (pointer)CONCAT44(in_stack_fffffffffffff034,in_stack_fffffffffffff030),
               (unsigned_long)in_stack_fffffffffffff028);
    boost::unit_test::operator<<
              ((lazy_ostream *)CONCAT44(in_stack_fffffffffffff034,in_stack_fffffffffffff030),
               (basic_cstring<const_char> *)in_stack_fffffffffffff028);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff038,
               (pointer)CONCAT44(in_stack_fffffffffffff034,in_stack_fffffffffffff030),
               (unsigned_long)in_stack_fffffffffffff028);
    in_stack_fffffffffffff028 = (CCoinsViewCache *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_770,local_790,local_7b0,0x113,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)in_stack_fffffffffffff028);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_fffffffffffff028);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff038,
               (pointer)CONCAT44(in_stack_fffffffffffff034,in_stack_fffffffffffff030),
               (unsigned_long)in_stack_fffffffffffff028);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffff028);
    boost::unit_test::unit_test_log_t::set_checkpoint
              (in_stack_fffffffffffff068,(const_string *)in_stack_fffffffffffff060,
               CONCAT17(in_stack_fffffffffffff05f,in_stack_fffffffffffff058),
               (const_string *)in_stack_fffffffffffff050);
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)in_stack_fffffffffffff038,
               SUB41(in_stack_fffffffffffff034 >> 0x18,0));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff038,
               (pointer)CONCAT44(in_stack_fffffffffffff034,in_stack_fffffffffffff030),
               (unsigned_long)in_stack_fffffffffffff028);
    boost::unit_test::operator<<
              ((lazy_ostream *)CONCAT44(in_stack_fffffffffffff034,in_stack_fffffffffffff030),
               (basic_cstring<const_char> *)in_stack_fffffffffffff028);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff038,
               (pointer)CONCAT44(in_stack_fffffffffffff034,in_stack_fffffffffffff030),
               (unsigned_long)in_stack_fffffffffffff028);
    in_stack_fffffffffffff028 = (CCoinsViewCache *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_7e8,local_808,local_828,0x114,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)in_stack_fffffffffffff028);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_fffffffffffff028);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff038,
               (pointer)CONCAT44(in_stack_fffffffffffff034,in_stack_fffffffffffff030),
               (unsigned_long)in_stack_fffffffffffff028);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffff028);
    boost::unit_test::unit_test_log_t::set_checkpoint
              (in_stack_fffffffffffff068,(const_string *)in_stack_fffffffffffff060,
               CONCAT17(in_stack_fffffffffffff05f,in_stack_fffffffffffff058),
               (const_string *)in_stack_fffffffffffff050);
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)in_stack_fffffffffffff038,
               SUB41(in_stack_fffffffffffff034 >> 0x18,0));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff038,
               (pointer)CONCAT44(in_stack_fffffffffffff034,in_stack_fffffffffffff030),
               (unsigned_long)in_stack_fffffffffffff028);
    boost::unit_test::operator<<
              ((lazy_ostream *)CONCAT44(in_stack_fffffffffffff034,in_stack_fffffffffffff030),
               (basic_cstring<const_char> *)in_stack_fffffffffffff028);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff038,
               (pointer)CONCAT44(in_stack_fffffffffffff034,in_stack_fffffffffffff030),
               (unsigned_long)in_stack_fffffffffffff028);
    in_stack_fffffffffffff028 = (CCoinsViewCache *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_860,local_880,local_8a0,0x115,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)in_stack_fffffffffffff028);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_fffffffffffff028);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff038,
               (pointer)CONCAT44(in_stack_fffffffffffff034,in_stack_fffffffffffff030),
               (unsigned_long)in_stack_fffffffffffff028);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffff028);
    boost::unit_test::unit_test_log_t::set_checkpoint
              (in_stack_fffffffffffff068,(const_string *)in_stack_fffffffffffff060,
               CONCAT17(in_stack_fffffffffffff05f,in_stack_fffffffffffff058),
               (const_string *)in_stack_fffffffffffff050);
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)in_stack_fffffffffffff038,
               SUB41(in_stack_fffffffffffff034 >> 0x18,0));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff038,
               (pointer)CONCAT44(in_stack_fffffffffffff034,in_stack_fffffffffffff030),
               (unsigned_long)in_stack_fffffffffffff028);
    boost::unit_test::operator<<
              ((lazy_ostream *)CONCAT44(in_stack_fffffffffffff034,in_stack_fffffffffffff030),
               (basic_cstring<const_char> *)in_stack_fffffffffffff028);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff038,
               (pointer)CONCAT44(in_stack_fffffffffffff034,in_stack_fffffffffffff030),
               (unsigned_long)in_stack_fffffffffffff028);
    in_stack_fffffffffffff028 = (CCoinsViewCache *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_8d8,local_8f8,local_918,0x116,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)in_stack_fffffffffffff028);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_fffffffffffff028);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff038,
               (pointer)CONCAT44(in_stack_fffffffffffff034,in_stack_fffffffffffff030),
               (unsigned_long)in_stack_fffffffffffff028);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffff028);
    boost::unit_test::unit_test_log_t::set_checkpoint
              (in_stack_fffffffffffff068,(const_string *)in_stack_fffffffffffff060,
               CONCAT17(in_stack_fffffffffffff05f,in_stack_fffffffffffff058),
               (const_string *)in_stack_fffffffffffff050);
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)in_stack_fffffffffffff038,
               SUB41(in_stack_fffffffffffff034 >> 0x18,0));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff038,
               (pointer)CONCAT44(in_stack_fffffffffffff034,in_stack_fffffffffffff030),
               (unsigned_long)in_stack_fffffffffffff028);
    boost::unit_test::operator<<
              ((lazy_ostream *)CONCAT44(in_stack_fffffffffffff034,in_stack_fffffffffffff030),
               (basic_cstring<const_char> *)in_stack_fffffffffffff028);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff038,
               (pointer)CONCAT44(in_stack_fffffffffffff034,in_stack_fffffffffffff030),
               (unsigned_long)in_stack_fffffffffffff028);
    in_stack_fffffffffffff028 = (CCoinsViewCache *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_950,local_970,local_990,0x117,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)in_stack_fffffffffffff028);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_fffffffffffff028);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff038,
               (pointer)CONCAT44(in_stack_fffffffffffff034,in_stack_fffffffffffff030),
               (unsigned_long)in_stack_fffffffffffff028);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffff028);
    boost::unit_test::unit_test_log_t::set_checkpoint
              (in_stack_fffffffffffff068,(const_string *)in_stack_fffffffffffff060,
               CONCAT17(in_stack_fffffffffffff05f,in_stack_fffffffffffff058),
               (const_string *)in_stack_fffffffffffff050);
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)in_stack_fffffffffffff038,
               SUB41(in_stack_fffffffffffff034 >> 0x18,0));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff038,
               (pointer)CONCAT44(in_stack_fffffffffffff034,in_stack_fffffffffffff030),
               (unsigned_long)in_stack_fffffffffffff028);
    boost::unit_test::operator<<
              ((lazy_ostream *)CONCAT44(in_stack_fffffffffffff034,in_stack_fffffffffffff030),
               (basic_cstring<const_char> *)in_stack_fffffffffffff028);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff038,
               (pointer)CONCAT44(in_stack_fffffffffffff034,in_stack_fffffffffffff030),
               (unsigned_long)in_stack_fffffffffffff028);
    in_stack_fffffffffffff028 = (CCoinsViewCache *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_9c8,local_9e8,local_a08,0x118,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)in_stack_fffffffffffff028);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_fffffffffffff028);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff038,
               (pointer)CONCAT44(in_stack_fffffffffffff034,in_stack_fffffffffffff030),
               (unsigned_long)in_stack_fffffffffffff028);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffff028);
    boost::unit_test::unit_test_log_t::set_checkpoint
              (in_stack_fffffffffffff068,(const_string *)in_stack_fffffffffffff060,
               CONCAT17(in_stack_fffffffffffff05f,in_stack_fffffffffffff058),
               (const_string *)in_stack_fffffffffffff050);
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)in_stack_fffffffffffff038,
               SUB41(in_stack_fffffffffffff034 >> 0x18,0));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff038,
               (pointer)CONCAT44(in_stack_fffffffffffff034,in_stack_fffffffffffff030),
               (unsigned_long)in_stack_fffffffffffff028);
    boost::unit_test::operator<<
              ((lazy_ostream *)CONCAT44(in_stack_fffffffffffff034,in_stack_fffffffffffff030),
               (basic_cstring<const_char> *)in_stack_fffffffffffff028);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff038,
               (pointer)CONCAT44(in_stack_fffffffffffff034,in_stack_fffffffffffff030),
               (unsigned_long)in_stack_fffffffffffff028);
    in_stack_fffffffffffff028 = (CCoinsViewCache *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_a40,local_a60,local_a80,0x119,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)in_stack_fffffffffffff028);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_fffffffffffff028);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff038,
               (pointer)CONCAT44(in_stack_fffffffffffff034,in_stack_fffffffffffff030),
               (unsigned_long)in_stack_fffffffffffff028);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffff028);
    boost::unit_test::unit_test_log_t::set_checkpoint
              (in_stack_fffffffffffff068,(const_string *)in_stack_fffffffffffff060,
               CONCAT17(in_stack_fffffffffffff05f,in_stack_fffffffffffff058),
               (const_string *)in_stack_fffffffffffff050);
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)in_stack_fffffffffffff038,
               SUB41(in_stack_fffffffffffff034 >> 0x18,0));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff038,
               (pointer)CONCAT44(in_stack_fffffffffffff034,in_stack_fffffffffffff030),
               (unsigned_long)in_stack_fffffffffffff028);
    boost::unit_test::operator<<
              ((lazy_ostream *)CONCAT44(in_stack_fffffffffffff034,in_stack_fffffffffffff030),
               (basic_cstring<const_char> *)in_stack_fffffffffffff028);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff038,
               (pointer)CONCAT44(in_stack_fffffffffffff034,in_stack_fffffffffffff030),
               (unsigned_long)in_stack_fffffffffffff028);
    in_stack_fffffffffffff028 = (CCoinsViewCache *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_ab8,local_ad8,local_af8,0x11a,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)in_stack_fffffffffffff028);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_fffffffffffff028);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  do {
    this_00 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff038,
               (pointer)CONCAT44(in_stack_fffffffffffff034,in_stack_fffffffffffff030),
               (unsigned_long)in_stack_fffffffffffff028);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffff028);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)this_00,(const_string *)in_stack_fffffffffffff060,
               CONCAT17(in_stack_fffffffffffff05f,in_stack_fffffffffffff058),
               (const_string *)in_stack_fffffffffffff050);
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)in_stack_fffffffffffff038,
               SUB41(in_stack_fffffffffffff034 >> 0x18,0));
    in_stack_fffffffffffff060 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff038,
               (pointer)CONCAT44(in_stack_fffffffffffff034,in_stack_fffffffffffff030),
               (unsigned_long)in_stack_fffffffffffff028);
    boost::unit_test::operator<<
              ((lazy_ostream *)CONCAT44(in_stack_fffffffffffff034,in_stack_fffffffffffff030),
               (basic_cstring<const_char> *)in_stack_fffffffffffff028);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff038,
               (pointer)CONCAT44(in_stack_fffffffffffff034,in_stack_fffffffffffff030),
               (unsigned_long)in_stack_fffffffffffff028);
    in_stack_fffffffffffff028 = (CCoinsViewCache *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_b30,local_b50,local_b70,0x11b,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)in_stack_fffffffffffff028);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_fffffffffffff028);
    in_stack_fffffffffffff05f = boost::test_tools::tt_detail::dummy_cond();
  } while ((bool)in_stack_fffffffffffff05f);
  do {
    msg = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff038,
               (pointer)CONCAT44(in_stack_fffffffffffff034,in_stack_fffffffffffff030),
               (unsigned_long)in_stack_fffffffffffff028);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffff028);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)this_00,(const_string *)in_stack_fffffffffffff060,
               CONCAT17(in_stack_fffffffffffff05f,in_stack_fffffffffffff058),msg);
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)in_stack_fffffffffffff038,
               SUB41(in_stack_fffffffffffff034 >> 0x18,0));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff038,
               (pointer)CONCAT44(in_stack_fffffffffffff034,in_stack_fffffffffffff030),
               (unsigned_long)in_stack_fffffffffffff028);
    boost::unit_test::operator<<
              ((lazy_ostream *)CONCAT44(in_stack_fffffffffffff034,in_stack_fffffffffffff030),
               (basic_cstring<const_char> *)in_stack_fffffffffffff028);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff038,
               (pointer)CONCAT44(in_stack_fffffffffffff034,in_stack_fffffffffffff030),
               (unsigned_long)in_stack_fffffffffffff028);
    in_stack_fffffffffffff028 = (CCoinsViewCache *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_ba8,local_bc8,local_be8,0x11c,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)in_stack_fffffffffffff028);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_fffffffffffff028);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  std::vector<transaction_identifier<false>,_std::allocator<transaction_identifier<false>_>_>::
  ~vector((vector<transaction_identifier<false>,_std::allocator<transaction_identifier<false>_>_> *)
          in_stack_fffffffffffff038);
  std::
  vector<std::unique_ptr<(anonymous_namespace)::CCoinsViewCacheTest,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::CCoinsViewCacheTest,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>_>_>
  ::~vector((vector<std::unique_ptr<(anonymous_namespace)::CCoinsViewCacheTest,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::CCoinsViewCacheTest,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>_>_>
             *)in_stack_fffffffffffff038);
  std::
  map<COutPoint,_Coin,_std::less<COutPoint>,_std::allocator<std::pair<const_COutPoint,_Coin>_>_>::
  ~map((map<COutPoint,_Coin,_std::less<COutPoint>,_std::allocator<std::pair<const_COutPoint,_Coin>_>_>
        *)in_stack_fffffffffffff028);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void SimulationTest(CCoinsView* base, bool fake_best_block)
{
    // Various coverage trackers.
    bool removed_all_caches = false;
    bool reached_4_caches = false;
    bool added_an_entry = false;
    bool added_an_unspendable_entry = false;
    bool removed_an_entry = false;
    bool updated_an_entry = false;
    bool found_an_entry = false;
    bool missed_an_entry = false;
    bool uncached_an_entry = false;
    bool flushed_without_erase = false;

    // A simple map to track what we expect the cache stack to represent.
    std::map<COutPoint, Coin> result;

    // The cache stack.
    std::vector<std::unique_ptr<CCoinsViewCacheTest>> stack; // A stack of CCoinsViewCaches on top.
    stack.push_back(std::make_unique<CCoinsViewCacheTest>(base)); // Start with one cache.

    // Use a limited set of random transaction ids, so we do test overwriting entries.
    std::vector<Txid> txids;
    txids.resize(NUM_SIMULATION_ITERATIONS / 8);
    for (unsigned int i = 0; i < txids.size(); i++) {
        txids[i] = Txid::FromUint256(m_rng.rand256());
    }

    for (unsigned int i = 0; i < NUM_SIMULATION_ITERATIONS; i++) {
        // Do a random modification.
        {
            auto txid = txids[m_rng.randrange(txids.size())]; // txid we're going to modify in this iteration.
            Coin& coin = result[COutPoint(txid, 0)];

            // Determine whether to test HaveCoin before or after Access* (or both). As these functions
            // can influence each other's behaviour by pulling things into the cache, all combinations
            // are tested.
            bool test_havecoin_before = m_rng.randbits(2) == 0;
            bool test_havecoin_after = m_rng.randbits(2) == 0;

            bool result_havecoin = test_havecoin_before ? stack.back()->HaveCoin(COutPoint(txid, 0)) : false;

            // Infrequently, test usage of AccessByTxid instead of AccessCoin - the
            // former just delegates to the latter and returns the first unspent in a txn.
            const Coin& entry = (m_rng.randrange(500) == 0) ?
                AccessByTxid(*stack.back(), txid) : stack.back()->AccessCoin(COutPoint(txid, 0));
            BOOST_CHECK(coin == entry);

            if (test_havecoin_before) {
                BOOST_CHECK(result_havecoin == !entry.IsSpent());
            }

            if (test_havecoin_after) {
                bool ret = stack.back()->HaveCoin(COutPoint(txid, 0));
                BOOST_CHECK(ret == !entry.IsSpent());
            }

            if (m_rng.randrange(5) == 0 || coin.IsSpent()) {
                Coin newcoin;
                newcoin.out.nValue = RandMoney(m_rng);
                newcoin.nHeight = 1;

                // Infrequently test adding unspendable coins.
                if (m_rng.randrange(16) == 0 && coin.IsSpent()) {
                    newcoin.out.scriptPubKey.assign(1 + m_rng.randbits(6), OP_RETURN);
                    BOOST_CHECK(newcoin.out.scriptPubKey.IsUnspendable());
                    added_an_unspendable_entry = true;
                } else {
                    // Random sizes so we can test memory usage accounting
                    newcoin.out.scriptPubKey.assign(m_rng.randbits(6), 0);
                    (coin.IsSpent() ? added_an_entry : updated_an_entry) = true;
                    coin = newcoin;
                }
                bool is_overwrite = !coin.IsSpent() || m_rng.rand32() & 1;
                stack.back()->AddCoin(COutPoint(txid, 0), std::move(newcoin), is_overwrite);
            } else {
                // Spend the coin.
                removed_an_entry = true;
                coin.Clear();
                BOOST_CHECK(stack.back()->SpendCoin(COutPoint(txid, 0)));
            }
        }

        // Once every 10 iterations, remove a random entry from the cache
        if (m_rng.randrange(10) == 0) {
            COutPoint out(txids[m_rng.rand32() % txids.size()], 0);
            int cacheid = m_rng.rand32() % stack.size();
            stack[cacheid]->Uncache(out);
            uncached_an_entry |= !stack[cacheid]->HaveCoinInCache(out);
        }

        // Once every 1000 iterations and at the end, verify the full cache.
        if (m_rng.randrange(1000) == 1 || i == NUM_SIMULATION_ITERATIONS - 1) {
            for (const auto& entry : result) {
                bool have = stack.back()->HaveCoin(entry.first);
                const Coin& coin = stack.back()->AccessCoin(entry.first);
                BOOST_CHECK(have == !coin.IsSpent());
                BOOST_CHECK(coin == entry.second);
                if (coin.IsSpent()) {
                    missed_an_entry = true;
                } else {
                    BOOST_CHECK(stack.back()->HaveCoinInCache(entry.first));
                    found_an_entry = true;
                }
            }
            for (const auto& test : stack) {
                test->SelfTest();
            }
        }

        if (m_rng.randrange(100) == 0) {
            // Every 100 iterations, flush an intermediate cache
            if (stack.size() > 1 && m_rng.randbool() == 0) {
                unsigned int flushIndex = m_rng.randrange(stack.size() - 1);
                if (fake_best_block) stack[flushIndex]->SetBestBlock(m_rng.rand256());
                bool should_erase = m_rng.randrange(4) < 3;
                BOOST_CHECK(should_erase ? stack[flushIndex]->Flush() : stack[flushIndex]->Sync());
                flushed_without_erase |= !should_erase;
            }
        }
        if (m_rng.randrange(100) == 0) {
            // Every 100 iterations, change the cache stack.
            if (stack.size() > 0 && m_rng.randbool() == 0) {
                //Remove the top cache
                if (fake_best_block) stack.back()->SetBestBlock(m_rng.rand256());
                bool should_erase = m_rng.randrange(4) < 3;
                BOOST_CHECK(should_erase ? stack.back()->Flush() : stack.back()->Sync());
                flushed_without_erase |= !should_erase;
                stack.pop_back();
            }
            if (stack.size() == 0 || (stack.size() < 4 && m_rng.randbool())) {
                //Add a new cache
                CCoinsView* tip = base;
                if (stack.size() > 0) {
                    tip = stack.back().get();
                } else {
                    removed_all_caches = true;
                }
                stack.push_back(std::make_unique<CCoinsViewCacheTest>(tip));
                if (stack.size() == 4) {
                    reached_4_caches = true;
                }
            }
        }
    }

    // Verify coverage.
    BOOST_CHECK(removed_all_caches);
    BOOST_CHECK(reached_4_caches);
    BOOST_CHECK(added_an_entry);
    BOOST_CHECK(added_an_unspendable_entry);
    BOOST_CHECK(removed_an_entry);
    BOOST_CHECK(updated_an_entry);
    BOOST_CHECK(found_an_entry);
    BOOST_CHECK(missed_an_entry);
    BOOST_CHECK(uncached_an_entry);
    BOOST_CHECK(flushed_without_erase);
}